

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateData::getData
          (StateData *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *data,
          Vector<double,_std::allocator<double>_> *datatime,Real time)

{
  double dVar1;
  double dVar2;
  pointer ppMVar3;
  pointer pdVar4;
  TimeCenter TVar5;
  TimeInterval *__x;
  double dVar6;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_48;
  double local_40;
  Real local_38;
  
  ppMVar3 = (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar3) {
    (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar3;
  }
  pdVar4 = (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((datatime->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar4) {
    (datatime->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar4;
  }
  local_40 = time;
  local_38 = time;
  TVar5 = StateDescriptor::timeType(this->desc);
  if (TVar5 == Point) {
    local_48._M_head_impl =
         (this->old_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (local_48._M_head_impl == (MultiFab *)0x0) {
      local_48._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::emplace_back<amrex::MultiFab*>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
                 &local_48._M_head_impl);
      __x = &this->new_time;
    }
    else {
      __x = &this->new_time;
      dVar1 = (this->new_time).start;
      dVar2 = (this->old_time).start;
      dVar6 = (dVar1 - dVar2) * 0.001;
      if ((local_40 <= dVar1 - dVar6) || (dVar1 + dVar6 <= local_40)) {
        if ((local_40 <= dVar2 - dVar6) || (dVar2 + dVar6 <= local_40)) {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          emplace_back<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
                     &local_48._M_head_impl);
          local_48._M_head_impl =
               (this->new_data)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          emplace_back<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
                     &local_48._M_head_impl);
          std::vector<double,_std::allocator<double>_>::push_back
                    (&datatime->super_vector<double,_std::allocator<double>_>,
                     &(this->old_time).start);
        }
        else {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          emplace_back<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
                     &local_48._M_head_impl);
          __x = &this->old_time;
        }
      }
      else {
        local_48._M_head_impl =
             (this->new_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        emplace_back<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
                   &local_48._M_head_impl);
      }
    }
  }
  else {
    dVar1 = (this->new_time).start;
    dVar2 = (this->old_time).start;
    dVar6 = (dVar1 - dVar2) * 0.001;
    if ((local_40 <= dVar1 - dVar6) || ((this->new_time).stop + dVar6 <= local_40)) {
      local_48._M_head_impl =
           (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if ((local_40 <= dVar2 - dVar6 || local_48._M_head_impl == (MultiFab *)0x0) ||
         (dVar6 + (this->old_time).stop <= local_40)) {
        Error_host("StateData::getData(): how did we get here?");
        return;
      }
    }
    else {
      local_48._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    }
    std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::emplace_back<amrex::MultiFab*>
              ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,
               &local_48._M_head_impl);
    __x = (TimeInterval *)&local_38;
  }
  std::vector<double,_std::allocator<double>_>::push_back
            (&datatime->super_vector<double,_std::allocator<double>_>,&__x->start);
  return;
}

Assistant:

void
StateData::getData (Vector<MultiFab*>& data,
                    Vector<Real>& datatime,
                    Real time) const
{
    data.clear();
    datatime.clear();

    if (desc->timeType() == StateDescriptor::Point)
    {
        BL_ASSERT(new_data != nullptr);
        if (old_data == nullptr)
        {
            data.push_back(new_data.get());
            datatime.push_back(new_time.start);
        }
        else
        {
            const Real teps = (new_time.start - old_time.start)*1.e-3_rt;
            if (time > new_time.start-teps && time < new_time.start+teps) {
                data.push_back(new_data.get());
                datatime.push_back(new_time.start);
            } else if (time > old_time.start-teps && time < old_time.start+teps) {
                data.push_back(old_data.get());
                datatime.push_back(old_time.start);
            } else {
                data.push_back(old_data.get());
                data.push_back(new_data.get());
                datatime.push_back(old_time.start);
                datatime.push_back(new_time.start);
            }
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            data.push_back(new_data.get());
            datatime.push_back(time);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            data.push_back(old_data.get());
            datatime.push_back(time);
        }
        else
        {
            amrex::Error("StateData::getData(): how did we get here?");
        }
    }
}